

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

string * __thiscall
ctemplate::PrettyPrintOneModifier_abi_cxx11_
          (string *__return_storage_ptr__,ctemplate *this,ModifierAndValue *modval)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (*(char *)(*(long *)this + 0x20) == '\0') {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::append((ulong)__return_storage_ptr__,'\x01');
  }
  if (*(long *)(this + 0x10) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,*(ulong *)(this + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

string PrettyPrintOneModifier(const ModifierAndValue& modval) {
  string out;
  out.append(":");
  if (modval.modifier_info->short_name)      // short_name is a char.
    out.append(1, modval.modifier_info->short_name);
  else
    out.append(modval.modifier_info->long_name);
  if (modval.value_len != 0)
    out.append(modval.value, modval.value_len);
  return out;
}